

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::CheckRelaxPrecisionDecoration
          (ValidationState_t *vstate,Instruction *inst,Decoration *decoration)

{
  Op OVar1;
  int32_t iVar2;
  int iVar3;
  DiagnosticStream *this;
  DiagnosticStream local_200;
  Decoration *local_28;
  Decoration *decoration_local;
  Instruction *inst_local;
  ValidationState_t *vstate_local;
  
  local_28 = decoration;
  decoration_local = (Decoration *)inst;
  inst_local = (Instruction *)vstate;
  OVar1 = Instruction::opcode(inst);
  iVar2 = spvOpcodeGeneratesType(OVar1);
  if (iVar2 == 0) {
    vstate_local._4_4_ = SPV_SUCCESS;
  }
  else {
    iVar3 = Decoration::struct_member_index(local_28);
    if ((iVar3 != -1) &&
       (OVar1 = Instruction::opcode((Instruction *)decoration_local), OVar1 == OpTypeStruct)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag
              (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
               (Instruction *)decoration_local);
    this = DiagnosticStream::operator<<
                     (&local_200,
                      (char (*) [54])"RelaxPrecision decoration cannot be applied to a type");
    vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(this);
    DiagnosticStream::~DiagnosticStream(&local_200);
  }
  return vstate_local._4_4_;
}

Assistant:

spv_result_t CheckRelaxPrecisionDecoration(ValidationState_t& vstate,
                                           const Instruction& inst,
                                           const Decoration& decoration) {
  // This is not the most precise check, but the rules for RelaxPrecision are
  // very general, and it will be difficult to implement precisely.  For now,
  // I will only check for the cases that cause problems for the optimizer.
  if (!spvOpcodeGeneratesType(inst.opcode())) {
    return SPV_SUCCESS;
  }

  if (decoration.struct_member_index() != Decoration::kInvalidMember &&
      inst.opcode() == spv::Op::OpTypeStruct) {
    return SPV_SUCCESS;
  }
  return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
         << "RelaxPrecision decoration cannot be applied to a type";
}